

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O0

void different_types(void)

{
  rtosc_cmp_options *unaff_retaddr;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  rtosc_arg_val_t *in_stack_00000018;
  rtosc_arg_val_t *in_stack_00000020;
  char *in_stack_00000030;
  int in_stack_00000038;
  char *in_stack_fffffffffffffff8;
  
  l[0].type = 'i';
  l[0].val.i = 0;
  r[0].type = 'h';
  r[0].val.d = 4.94065645841247e-324;
  cmp_gt(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
         in_stack_fffffffffffffff8,in_stack_00000030,in_stack_00000038);
  return;
}

Assistant:

void different_types()
{
    l[0].type = 'i';
    l[0].val.i = 0;
    r[0].type = 'h';
    r[0].val.h = 1;

    // 1 > 0, but 'i' > 'h' (alphabetically)
    cmp_gt(l, r, 1, 1, NULL, "int type", "huge int type", __LINE__);
}